

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

int height_from_owner_or_zero_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *this;
  Am_Slot_Key key;
  Am_Object owner;
  Am_Object local_18;
  
  iVar2 = 0;
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,&Am_Scrolling_Group);
    bVar1 = Am_Object::Is_Instance_Of(&owner,&local_18);
    Am_Object::~Am_Object(&local_18);
    key = 0x67;
    if (bVar1) {
      key = 399;
    }
    this = Am_Object::Get(&owner,key,0);
    iVar2 = Am_Value::operator_cast_to_int(this);
  }
  Am_Object::~Am_Object(&owner);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, height_from_owner_or_zero)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    if (owner.Is_Instance_Of(Am_Scrolling_Group))
      return owner.Get(Am_INNER_HEIGHT);
    else
      return owner.Get(Am_HEIGHT);
  } else
    return 0;
}